

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

sunrealtype **
SplittingStepCoefficients_ComposeStrangHelper
          (int partitions,int order,int composition_stages,sunrealtype start,sunrealtype end,
          sunrealtype **beta)

{
  sunrealtype **in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  sunrealtype **beta_00;
  double in_XMM1_Qa;
  sunrealtype end_cur;
  int i;
  sunrealtype gamma;
  sunrealtype start_cur;
  sunrealtype **beta_cur;
  int k;
  int j;
  sunrealtype mid;
  sunrealtype diff;
  sunrealtype local_78;
  int local_64;
  sunrealtype **local_50;
  int local_48;
  int local_44;
  sunrealtype **end_00;
  int in_stack_ffffffffffffffe8;
  sunrealtype **local_8;
  
  beta_00 = (sunrealtype **)(in_XMM1_Qa - in_XMM0_Qa);
  if (in_ESI == 2) {
    for (local_44 = 1; local_44 <= in_EDI; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < in_EDI; local_48 = local_48 + 1) {
        local_78 = in_XMM1_Qa;
        if (local_48 + local_44 < in_EDI) {
          local_78 = in_XMM0_Qa + (double)beta_00 / 2.0;
        }
        in_RCX[local_44][local_48] = local_78;
      }
    }
    local_8 = in_RCX + (in_EDI + -1);
  }
  else {
    end_00 = in_RCX;
    pow((double)(in_EDX + -1),1.0 / (double)(in_ESI + -1));
    local_50 = in_RCX;
    for (local_64 = 1; local_64 <= in_EDX; local_64 = local_64 + 1) {
      local_50 = SplittingStepCoefficients_ComposeStrangHelper
                           (in_EDX,in_stack_ffffffffffffffe8,(int)((ulong)in_XMM0_Qa >> 0x20),
                            in_XMM1_Qa,(sunrealtype)end_00,beta_00);
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

static sunrealtype* const* SplittingStepCoefficients_ComposeStrangHelper(
  const int partitions, const int order, const int composition_stages,
  const sunrealtype start, const sunrealtype end, sunrealtype* const* const beta)
{
  const sunrealtype diff = end - start;
  if (order == 2)
  {
    /* The base case is an order 2 Strang splitting */
    const sunrealtype mid = start + diff / SUN_RCONST(2.0);
    for (int j = 1; j <= partitions; j++)
    {
      for (int k = 0; k < partitions; k++)
      {
        beta[j][k] = (k + j < partitions) ? mid : end;
      }
    }

    return &beta[partitions - 1];
  }

  sunrealtype* const* beta_cur = beta;
  sunrealtype start_cur        = start;
  /* This is essentially the gamma coefficient from Geometric Numerical
   * Integration (https://doi.org/10.1007/3-540-30666-8) pg 44-45 scaled by the
   * current interval */
  const sunrealtype gamma =
    diff / (composition_stages - 1 -
            SUNRpowerR(composition_stages - 1, SUN_RCONST(1.0) / (order - 1)));
  for (int i = 1; i <= composition_stages; i++)
  {
    /* To avoid roundoff issues, this ensures end_cur=1 for the last value of i*/
    const sunrealtype end_cur = 2 * i < composition_stages
                                  ? (start + i * gamma)
                                  : (end + (i - composition_stages) * gamma);
    /* Recursively generate coefficients and shift beta_cur */
    beta_cur  = SplittingStepCoefficients_ComposeStrangHelper(partitions,
                                                              order - 2,
                                                              composition_stages,
                                                              start_cur, end_cur,
                                                              beta_cur);
    start_cur = end_cur;
  }

  return beta_cur;
}